

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O1

bool vkt::pipeline::multisample::checkForErrorRS
               (VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS,deUint32 errorCompNdx)

{
  uint y;
  uint z;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool local_4a;
  int local_40 [4];
  
  local_4a = (imageRSInfo->extent).depth != 0;
  if (local_4a) {
    uVar1 = 0;
    do {
      bVar2 = (imageRSInfo->extent).height != 0;
      if (bVar2) {
        z = 0;
        do {
          bVar3 = (imageRSInfo->extent).width != 0;
          if (bVar3) {
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_40,(int)dataRS,0,z);
            if (local_40[(int)errorCompNdx] == 0) {
              y = 1;
              do {
                bVar3 = y < (imageRSInfo->extent).width;
                if (!bVar3) goto LAB_004c59c2;
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_40,(int)dataRS,y,z);
                y = y + 1;
              } while (local_40[(int)errorCompNdx] == 0);
            }
            if (bVar3) {
              if (bVar2) {
                return local_4a;
              }
              break;
            }
          }
LAB_004c59c2:
          z = z + 1;
          bVar2 = z < (imageRSInfo->extent).height;
        } while (bVar2);
      }
      uVar1 = uVar1 + 1;
      local_4a = uVar1 < (imageRSInfo->extent).depth;
    } while (local_4a);
  }
  return local_4a;
}

Assistant:

bool checkForErrorRS (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS, const deUint32 errorCompNdx)
{
	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const deUint32 errorComponent = dataRS.getPixelUint(x, y, z)[errorCompNdx];

		if (errorComponent > 0)
			return true;
	}

	return false;
}